

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guha_join_ti_impl.h
# Opt level: O2

void __thiscall
join::
GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::execute_rsc_join(GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
                   *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                         *trees_collection,
                  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
                  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                  *join_result,double distance_threshold)

{
  pointer pNVar1;
  pointer pNVar2;
  allocator_type local_a2;
  allocator_type local_a1;
  double local_a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ub_vectors;
  vector<int,_std::allocator<int>_> reference_set;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  lb_vectors;
  
  local_a0 = distance_threshold;
  get_reference_set(&reference_set,this,trees_collection,distance_threshold);
  pNVar1 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&ub_vectors,
             (long)reference_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)reference_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_60);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&lb_vectors,((long)pNVar2 - (long)pNVar1) / 0x38,(value_type *)&ub_vectors,&local_a2);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&ub_vectors);
  pNVar1 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (long)reference_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)reference_set.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_a2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&ub_vectors,((long)pNVar2 - (long)pNVar1) / 0x38,(value_type *)&local_60,&local_a1);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  compute_vectors(this,trees_collection,&reference_set,&lb_vectors,&ub_vectors);
  retrieve_metric_candidates(this,candidates,join_result,local_a0,&lb_vectors,&ub_vectors);
  retrieve_sc_candidates(this,trees_collection,candidates,join_result,local_a0);
  verify_candidates(this,trees_collection,candidates,join_result,local_a0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&ub_vectors);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&lb_vectors);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&reference_set.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void GuhaJoinTI<Label, VerificationAlgorithm>::execute_rsc_join(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {
  
  std::vector<int> reference_set = get_reference_set(
      trees_collection, distance_threshold
  );
  
  std::vector<std::vector<double>> lb_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  std::vector<std::vector<double>> ub_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  
  // Compute the vectors.
  compute_vectors(trees_collection, reference_set, lb_vectors, ub_vectors);
  
  // Retrieves candidates from the candidate index.
  retrieve_metric_candidates(candidates, join_result, distance_threshold, lb_vectors, ub_vectors);
  retrieve_sc_candidates(trees_collection, candidates, join_result, distance_threshold);

  // Verify all computed join candidates and return the join result.
  verify_candidates(trees_collection, candidates, join_result, distance_threshold);
}